

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive.c
# Opt level: O0

void * allocmem(memory *m,int elemsize)

{
  int iVar1;
  void *pvVar2;
  int elemsize_local;
  memory *m_local;
  
  if (m->current < m->last) {
    m->current = (void *)((long)m->current + (long)elemsize);
  }
  else {
    iVar1 = m->nr + 1;
    m->nr = iVar1;
    if (99 < iVar1) {
      return (void *)0x0;
    }
    if (m->allocnr < m->nr) {
      pvVar2 = malloc((long)m->blocksize);
      m->block[m->nr] = pvVar2;
      m->allocnr = m->allocnr + 1;
    }
    pvVar2 = m->block[m->nr];
    m->first = pvVar2;
    m->current = pvVar2;
    m->last = (void *)((long)m->first + ((long)m->blocksize - (long)elemsize));
  }
  return m->current;
}

Assistant:

void *allocmem(memory *m, int elemsize)
{
   if (m->current < m->last)
      m->current = (void *) ((char *) (m->current) + elemsize);
   else {
      if (++m->nr >= MAXBLOCKS) return NULL;
      if (m->nr > m->allocnr) {
         m->block[m->nr] = malloc(m->blocksize);
         m->allocnr++;
      }
      m->current = m->first = m->block[m->nr];
      m->last = (void *)
         ((char *) (m->first) + m->blocksize - elemsize);
   }
   return m->current;
}